

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void __thiscall FPalette::SetPalette(FPalette *this,BYTE *colors)

{
  int i;
  int iVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    this->BaseColors[lVar2].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         ((uint)colors[1] << 8 | (uint)*colors << 0x10 | (uint)colors[2]);
    this->Remap[lVar2] = (BYTE)lVar2;
    colors = colors + 3;
  }
  iVar1 = BestColor((uint32 *)this,0xff,0xff,0xff,0,0xff);
  this->WhiteIndex = (BYTE)iVar1;
  iVar1 = BestColor((uint32 *)this,0,0,0,0,0xff);
  this->BlackIndex = (BYTE)iVar1;
  return;
}

Assistant:

void FPalette::SetPalette (const BYTE *colors)
{
	for (int i = 0; i < 256; i++, colors += 3)
	{
		BaseColors[i] = PalEntry (colors[0], colors[1], colors[2]);
		Remap[i] = i;
	}

	// Find white and black from the original palette so that they can be
	// used to make an educated guess of the translucency % for a BOOM
	// translucency map.
	WhiteIndex = BestColor ((DWORD *)BaseColors, 255, 255, 255, 0, 255);
	BlackIndex = BestColor ((DWORD *)BaseColors, 0, 0, 0, 0, 255);
}